

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionProxy::SetCrossSiteDeferredFunctionType(FunctionProxy *this,ScriptFunctionType *type)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ParseableFunctionInfo *this_00;
  
  BVar3 = HasParseableInfo(this);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x851,"(HasParseableInfo())","HasParseableInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = GetParseableFunctionInfo(this);
  ParseableFunctionInfo::SetCrossSiteDeferredFunctionType(this_00,type);
  return;
}

Assistant:

void FunctionProxy::SetCrossSiteDeferredFunctionType(ScriptFunctionType * type)
    {
        Assert(HasParseableInfo());
        GetParseableFunctionInfo()->SetCrossSiteDeferredFunctionType(type);
    }